

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

Maybe<capnp::compiler::NodeTranslator::BrandedDecl> * __thiscall
capnp::compiler::NodeTranslator::BrandScope::compileDeclExpression
          (Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *__return_storage_ptr__,
          BrandScope *this,Reader source,Resolver *resolver,ImplicitParams implicitMethodParams)

{
  uint *puVar1;
  Reader *pRVar2;
  ErrorReporter *pEVar3;
  Reader source_00;
  Reader source_01;
  Reader source_02;
  ImplicitParams implicitMethodParams_00;
  ImplicitParams implicitMethodParams_01;
  ImplicitParams implicitMethodParams_02;
  Reader name_00;
  long lVar4;
  long *plVar5;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *pNVar6;
  undefined8 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  BrandedDecl *pBVar12;
  BrandedDecl *pBVar13;
  BrandedDecl *pBVar14;
  bool bVar15;
  undefined3 uVar16;
  undefined4 uVar17;
  undefined7 uVar18;
  undefined1 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined3 uVar22;
  undefined4 uVar23;
  undefined1 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined3 uVar33;
  undefined4 uVar34;
  undefined1 uVar35;
  undefined7 uVar36;
  undefined7 uVar37;
  size_t sVar38;
  int iVar39;
  uint uVar40;
  BrandScope *pBVar41;
  CapTableReader *pCVar42;
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *pMVar43;
  undefined2 uVar44;
  uint uVar45;
  ArrayPtr<const_char> *params_1;
  WirePointer *pWVar46;
  char *pcVar47;
  SegmentReader *pSVar48;
  ulong uVar49;
  ArrayPtr<const_char> *pAVar50;
  unsigned_long i;
  uint uVar51;
  ElementCount EVar52;
  undefined4 index;
  ulong uVar53;
  SegmentReader *pSVar54;
  undefined1 uVar55;
  undefined8 uVar56;
  CapTableReader *pCVar57;
  Refcounted *refcounted;
  undefined8 uVar58;
  bool bVar59;
  Reader RVar60;
  StringPtr memberName;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> memberDecl;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> decl;
  Reader name;
  Reader param;
  ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl> compiledParams;
  Reader name_2;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> result;
  byte local_4a1;
  undefined4 uVar61;
  ListElementCount LVar62;
  undefined4 in_stack_fffffffffffffb64;
  undefined4 uVar63;
  bool bVar64;
  undefined6 uVar65;
  undefined1 in_stack_fffffffffffffb7f;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 uVar66;
  undefined4 in_stack_fffffffffffffb84;
  undefined7 in_stack_fffffffffffffb88;
  undefined7 uVar67;
  undefined7 uVar68;
  undefined1 in_stack_fffffffffffffb8f;
  undefined1 uVar69;
  undefined1 uVar70;
  undefined4 uStack_470;
  undefined3 uStack_46c;
  undefined1 uStack_469;
  undefined4 uStack_468;
  undefined3 uStack_464;
  undefined1 local_461;
  undefined7 uStack_460;
  undefined1 uStack_459;
  undefined7 uStack_458;
  undefined1 uStack_451;
  undefined1 local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined8 uStack_410;
  undefined4 local_408;
  undefined4 uStack_404;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  undefined4 local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 local_3e8;
  undefined4 uStack_3e4;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  undefined1 local_3d8 [104];
  Disposer *local_370;
  BrandScope *local_368;
  BrandScope *pBStack_360;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  ElementCount EStack_34c;
  undefined4 uStack_348;
  uint uStack_344;
  StructDataBitCount local_340;
  undefined4 uStack_33c;
  uint uStack_338;
  undefined4 uStack_334;
  uint uStack_330;
  undefined4 uStack_32c;
  ListReader local_328;
  Own<capnp::compiler::NodeTranslator::BrandScope> *local_2f0;
  StructReader local_2e8;
  BrandedDecl *local_2b8;
  BrandedDecl *pBStack_2b0;
  BrandedDecl *local_2a8;
  ArrayDisposer *local_2a0;
  undefined1 local_298 [7];
  undefined1 auStack_291 [8];
  undefined1 auStack_289 [165];
  undefined8 uStack_1e4;
  ElementCount EStack_1dc;
  undefined4 local_1d8;
  uint uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  uint local_1c8;
  undefined4 uStack_1c4;
  uint uStack_1c0;
  undefined4 uStack_1bc;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> local_1b8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_188;
  PointerReader local_178;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  void *local_118;
  undefined1 auStack_110 [80];
  StructReader local_c0;
  StructReader local_90;
  StructReader local_60;
  
  uVar10 = local_3d8._38_2_;
  uVar8 = local_3d8._36_2_;
  if (source._reader.dataSize < 0x10) {
    uVar44 = 0;
  }
  else {
    uVar44 = *source._reader.data;
  }
  local_3d8._36_2_ = (undefined2)_uStack_464;
  uVar9 = local_3d8._36_2_;
  local_3d8._38_2_ = (undefined2)((uint)_uStack_464 >> 0x10);
  uVar11 = local_3d8._38_2_;
  local_3d8._36_2_ = uVar8;
  local_3d8._38_2_ = uVar10;
  switch(uVar44) {
  case 0:
    goto switchD_001d0874_caseD_0;
  case 1:
  case 2:
  case 3:
  case 4:
  case 6:
  case 7:
  case 8:
  case 0xd:
    uVar49 = 0;
    uVar53 = 0;
    if (0x3f < source._reader.dataSize) {
      uVar53 = (ulong)*(uint *)((long)source._reader.data + 4);
    }
    if (0x9f < source._reader.dataSize) {
      uVar49 = (ulong)*(uint *)((long)source._reader.data + 0x10);
    }
    (**this->errorReporter->_vptr_ErrorReporter)
              (this->errorReporter,uVar53,uVar49,"Expected name.",0xf);
    goto switchD_001d0874_caseD_0;
  case 5:
    local_3d8._8_8_ = source._reader.capTable;
    pWVar46 = source._reader.pointers;
    local_3d8._0_8_ = source._reader.segment;
    local_3d8._24_4_ = source._reader.nestingLimit;
    if (source._reader.pointerCount == 0) {
      local_3d8._8_8_ = (CapTableReader *)0x0;
      pWVar46 = (WirePointer *)0x0;
      local_3d8._0_8_ = (SegmentReader *)0x0;
      local_3d8._24_4_ = 0x7fffffff;
    }
    local_3d8._16_4_ = SUB84(pWVar46,0);
    local_3d8._20_4_ = (undefined4)((ulong)pWVar46 >> 0x20);
    pCVar57 = (CapTableReader *)0x0;
    capnp::_::PointerReader::getStruct
              ((StructReader *)local_298,(PointerReader *)local_3d8,(word *)0x0);
    local_3d8._16_4_ = 0;
    local_3d8._20_4_ = 0;
    local_3d8._0_8_ = (SegmentReader *)0x0;
    local_3d8._24_4_ = 0x7fffffff;
    if (auStack_289._21_2_ != 0) {
      local_3d8._0_8_ = CONCAT17(auStack_291[0],CONCAT61(local_298._1_6_,local_298[0]));
      pCVar57 = (CapTableReader *)CONCAT44(stack0xfffffffffffffd74,auStack_291._1_4_);
      local_3d8._24_4_ = auStack_289._25_4_;
      local_3d8._16_4_ = auStack_289._9_4_;
      local_3d8._20_4_ = auStack_289._13_4_;
    }
    local_3d8._8_8_ = pCVar57;
    RVar60 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_3d8,(void *)0x0,0)
    ;
    pAVar50 = RVar60.super_StringPtr.content.size_;
    uVar61 = RVar60.super_StringPtr.content.ptr._0_4_;
    uVar63 = RVar60.super_StringPtr.content.ptr._4_4_;
    uVar49 = (ulong)implicitMethodParams.params.reader.elementCount;
    if (uVar49 != 0) {
      pRVar2 = &(__return_storage_ptr__->ptr).field_1.value.source;
      local_2f0 = &(__return_storage_ptr__->ptr).field_1.value.brand;
      uVar53 = 0;
      do {
        uVar45 = (uint)uVar53;
        capnp::_::ListReader::getStructElement
                  ((StructReader *)local_3d8,&implicitMethodParams.params.reader,uVar45);
        bVar59 = false;
        RVar60 = capnp::_::PointerReader::getBlob<capnp::Text>
                           ((PointerReader *)&stack0xfffffffffffffb78,(void *)0x0,0);
        if (RVar60.super_StringPtr.content.size_ == pAVar50) {
          iVar39 = bcmp(RVar60.super_StringPtr.content.ptr,(void *)CONCAT44(uVar63,uVar61),
                        (size_t)((long)&RVar60.super_StringPtr.content.size_[-1].size_ + 7));
          bVar59 = iVar39 == 0;
        }
        if (bVar59) {
          if (implicitMethodParams.scopeId == 0) {
            (__return_storage_ptr__->ptr).field_1.value.source._reader.data = (void *)0x0;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers = (WirePointer *)0x0
            ;
            (pRVar2->_reader).segment = (SegmentReader *)0x0;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
                 (CapTableReader *)0x0;
            pNVar6 = &__return_storage_ptr__->ptr;
            *(StructDataBitCount *)((long)&pNVar6->field_1 + 0x98) = 0;
            *(StructPointerCount *)((long)&pNVar6->field_1 + 0x9c) = 0;
            *(undefined2 *)((long)&pNVar6->field_1 + 0x9e) = 0;
            (__return_storage_ptr__->ptr).isSet = true;
            (__return_storage_ptr__->ptr).field_1.value.body.tag = 2;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0;
          }
          else {
            uVar45 = uVar45 & 0xffff;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.data = (void *)0x0;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers = (WirePointer *)0x0
            ;
            (pRVar2->_reader).segment = (SegmentReader *)0x0;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
                 (CapTableReader *)0x0;
            pNVar6 = &__return_storage_ptr__->ptr;
            *(StructDataBitCount *)((long)&pNVar6->field_1 + 0x98) = 0;
            *(StructPointerCount *)((long)&pNVar6->field_1 + 0x9c) = 0;
            *(undefined2 *)((long)&pNVar6->field_1 + 0x9e) = 0;
            (__return_storage_ptr__->ptr).isSet = true;
            (__return_storage_ptr__->ptr).field_1.value.body.tag = 2;
            *(uint64_t *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
                 implicitMethodParams.scopeId;
          }
          *(uint *)((long)&(__return_storage_ptr__->ptr).field_1.value.body.field_1 + 8) = uVar45;
          local_2f0->disposer = (Disposer *)0x0;
          local_2f0->ptr = (BrandScope *)0x0;
          *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.source._reader.nestingLimit =
               0x7fffffff;
          if (bVar59) {
            return __return_storage_ptr__;
          }
        }
        uVar53 = uVar53 + 1;
      } while (uVar49 != uVar53);
    }
    params_1 = pAVar50;
    (**resolver->_vptr_Resolver)(local_3d8,resolver,CONCAT44(uVar63,uVar61));
    if (local_3d8[0] == (_)0x1) {
      params_1 = (ArrayPtr<const_char> *)(local_3d8._8_8_ & 0xffffffff);
      if (local_3d8._8_4_ == 1) {
        local_3d8._8_8_ = local_3d8._8_8_ & 0xffffffff00000000;
      }
      if (local_3d8._8_4_ == 2) {
        local_3d8._8_8_ = local_3d8._8_8_ & 0xffffffff00000000;
      }
    }
    if (local_3d8[0] == (_)0x0) {
      pEVar3 = this->errorReporter;
      local_328.segment = (SegmentReader *)0x2729cd;
      local_328.capTable = (CapTableReader *)0xd;
      local_2e8.capTable = (CapTableReader *)((long)&pAVar50[-1].size_ + 7);
      local_2e8.segment = (SegmentReader *)CONCAT44(uVar63,uVar61);
      kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                ((String *)local_3d8,(_ *)&local_328,(ArrayPtr<const_char> *)&local_2e8,params_1);
      pSVar48 = (SegmentReader *)local_3d8._0_8_;
      if ((CapTableReader *)local_3d8._8_8_ == (CapTableReader *)0x0) {
        pSVar48 = (SegmentReader *)0x28616d;
      }
      uVar49 = 0;
      uVar53 = 0;
      if (0x1f < (uint)auStack_289._17_4_) {
        uVar53 = (ulong)*(uint *)CONCAT17(auStack_289[8],auStack_289._1_7_);
      }
      if (0x3f < (uint)auStack_289._17_4_) {
        uVar49 = (ulong)*(uint *)(CONCAT17(auStack_289[8],auStack_289._1_7_) + 4);
      }
      (**pEVar3->_vptr_ErrorReporter)
                (pEVar3,uVar53,uVar49,pSVar48,
                 local_3d8._8_8_ +
                 (ulong)((CapTableReader *)local_3d8._8_8_ == (CapTableReader *)0x0));
      uVar56 = local_3d8._8_8_;
      uVar58 = local_3d8._0_8_;
      if ((SegmentReader *)local_3d8._0_8_ != (SegmentReader *)0x0) {
        local_3d8._0_8_ = (SegmentReader *)0x0;
        local_3d8._8_8_ = (CapTableReader *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(local_3d8._20_4_,local_3d8._16_4_))
                  ((undefined8 *)CONCAT44(local_3d8._20_4_,local_3d8._16_4_),uVar58,1,uVar56,uVar56,
                   0);
      }
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else {
      interpretResolve((BrandedDecl *)local_3d8,this,resolver,
                       (ResolveResult *)&stack0xfffffffffffffb80,source);
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.body.tag = local_3d8._0_4_;
      if (local_3d8._0_4_ == 2) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = local_3d8._8_8_;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             CONCAT44(local_3d8._20_4_,local_3d8._16_4_);
      }
      else if (local_3d8._0_4_ == 1) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = local_3d8._40_8_;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
             CONCAT44(local_3d8._28_4_,local_3d8._24_4_);
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
             CONCAT26(local_3d8._38_2_,CONCAT24(local_3d8._36_2_,local_3d8._32_4_));
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = local_3d8._8_8_;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             CONCAT44(local_3d8._20_4_,local_3d8._16_4_);
        *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = local_3d8[0x30];
        if (local_3d8[0x30] == '\x01') {
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = local_3d8._88_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = local_3d8._96_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = local_3d8._72_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = local_3d8._80_8_;
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
               CONCAT71(local_3d8._57_7_,local_3d8[0x38]);
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = local_3d8._64_8_;
        }
      }
      (__return_storage_ptr__->ptr).field_1.value.brand.disposer = local_370;
      (__return_storage_ptr__->ptr).field_1.value.brand.ptr = local_368;
      pNVar6 = &__return_storage_ptr__->ptr;
      *(StructDataBitCount *)((long)&pNVar6->field_1 + 0x98) = local_340;
      *(short *)((long)&pNVar6->field_1 + 0x9c) = (short)uStack_33c;
      *(short *)((long)&pNVar6->field_1 + 0x9e) = SUB42(uStack_33c,2);
      *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.source._reader.nestingLimit =
           CONCAT44(uStack_334,uStack_338);
      (__return_storage_ptr__->ptr).field_1.value.source._reader.data =
           (void *)CONCAT44(EStack_34c,uStack_350);
      (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers =
           (WirePointer *)CONCAT44(uStack_344,uStack_348);
      (__return_storage_ptr__->ptr).field_1.value.source._reader.segment =
           (SegmentReader *)pBStack_360;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
           (CapTableReader *)CONCAT44(uStack_354,uStack_358);
    }
    break;
  case 9:
    pCVar57 = source._reader.capTable;
    pWVar46 = source._reader.pointers;
    pSVar48 = source._reader.segment;
    iVar39 = source._reader.nestingLimit;
    if (source._reader.pointerCount == 0) {
      pCVar57 = (CapTableReader *)0x0;
      pWVar46 = (WirePointer *)0x0;
      pSVar48 = (SegmentReader *)0x0;
      iVar39 = 0x7fffffff;
    }
    bVar59 = SUB81(pSVar48,0);
    uVar63 = SUB84(pCVar57,0);
    uVar67 = SUB87(pWVar46,0);
    uVar69 = (undefined1)((ulong)pWVar46 >> 0x38);
    capnp::_::PointerReader::getStruct
              (&local_60,(PointerReader *)&stack0xfffffffffffffb78,(word *)0x0);
    implicitMethodParams_01.params.reader.step = implicitMethodParams.params.reader.step;
    implicitMethodParams_01.params.reader.elementCount =
         implicitMethodParams.params.reader.elementCount;
    source_01._reader.capTable = local_60.capTable;
    source_01._reader.segment = local_60.segment;
    source_01._reader.data = local_60.data;
    source_01._reader.pointers = local_60.pointers;
    source_01._reader.dataSize = local_60.dataSize;
    source_01._reader.pointerCount = local_60.pointerCount;
    source_01._reader._38_2_ = local_60._38_2_;
    source_01._reader.nestingLimit = local_60.nestingLimit;
    source_01._reader._44_4_ = local_60._44_4_;
    implicitMethodParams_01.params.reader.segment = implicitMethodParams.params.reader.segment;
    implicitMethodParams_01.scopeId = implicitMethodParams.scopeId;
    implicitMethodParams_01.params.reader.capTable = implicitMethodParams.params.reader.capTable;
    implicitMethodParams_01.params.reader.ptr = implicitMethodParams.params.reader.ptr;
    implicitMethodParams_01.params.reader.structDataSize =
         implicitMethodParams.params.reader.structDataSize;
    implicitMethodParams_01.params.reader.structPointerCount =
         implicitMethodParams.params.reader.structPointerCount;
    implicitMethodParams_01.params.reader.elementSize =
         implicitMethodParams.params.reader.elementSize;
    implicitMethodParams_01.params.reader._39_1_ = implicitMethodParams.params.reader._39_1_;
    implicitMethodParams_01.params.reader.nestingLimit =
         implicitMethodParams.params.reader.nestingLimit;
    implicitMethodParams_01.params.reader._44_4_ = implicitMethodParams.params.reader._44_4_;
    compileDeclExpression
              ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)&stack0xfffffffffffffb78,this,
               source_01,resolver,implicitMethodParams_01);
    uVar61 = local_3d8._16_4_;
    local_3d8[0] = (_)bVar59;
    if (bVar59 == true) {
      local_3d8._8_4_ = uVar63;
      local_3d8._16_4_ = (undefined4)uVar67;
      if (uVar63 == 2) {
        local_3d8._20_4_ = (undefined4)(CONCAT17(uVar69,uVar67) >> 0x20);
        local_3d8._28_4_ = _uStack_46c;
        uVar61 = local_3d8._16_4_;
        local_3d8._24_4_ = iVar39;
      }
      else if (uVar63 == 1) {
        local_3d8._48_8_ = CONCAT17(uStack_451,uStack_458);
        local_3d8._40_8_ = CONCAT17(uStack_459,uStack_460);
        local_3d8._32_4_ = uStack_468;
        local_3d8._20_4_ = (undefined4)(CONCAT17(uVar69,uVar67) >> 0x20);
        local_3d8._28_4_ = _uStack_46c;
        local_3d8[0x38] = local_450;
        uVar61 = local_3d8._16_4_;
        local_3d8._24_4_ = iVar39;
        local_3d8._36_2_ = uVar9;
        local_3d8._38_2_ = uVar11;
        if (local_450 == 1) {
          local_3d8._96_8_ = local_428;
          local_370 = (Disposer *)uStack_420;
          local_3d8._80_8_ = local_438;
          local_3d8._88_8_ = uStack_430;
          local_3d8._64_8_ = local_448;
          local_3d8._72_8_ = uStack_440;
        }
      }
      local_3d8._16_4_ = uVar61;
      local_368 = (BrandScope *)CONCAT44(uStack_414,local_418);
      uStack_32c = uStack_3dc;
      uStack_330 = uStack_3e0;
      uStack_334 = uStack_3e4;
      uStack_338 = local_3e8;
      uStack_33c = uStack_3ec;
      local_340 = uStack_3f0;
      uStack_344 = uStack_3f4;
      uStack_348 = local_3f8;
      EStack_34c = uStack_3fc;
      uStack_350 = uStack_400;
      uStack_354 = uStack_404;
      uStack_358 = local_408;
      pBStack_360 = (BrandScope *)uStack_410;
      uStack_410 = (BrandScope *)0x0;
    }
    if (bVar59 == true) {
      if (source._reader.pointerCount < 2) {
        EVar52 = 0x7fffffff;
        pCVar57 = (CapTableReader *)0x0;
        uVar58 = (BrandScope *)0x0;
        pSVar48 = (SegmentReader *)0x0;
      }
      else {
        uVar58 = source._reader.pointers + 1;
        pSVar48 = source._reader.segment;
        pCVar57 = source._reader.capTable;
        EVar52 = source._reader.nestingLimit;
      }
      bVar64 = SUB81(pSVar48,0);
      uVar66 = SUB84(pCVar57,0);
      uVar68 = (undefined7)uVar58;
      uVar70 = (undefined1)((ulong)uVar58 >> 0x38);
      capnp::_::PointerReader::getList
                (&local_328,(PointerReader *)&stack0xfffffffffffffb78,INLINE_COMPOSITE,(word *)0x0);
      uVar49 = (ulong)local_328.elementCount;
      local_2b8 = (BrandedDecl *)
                  kj::_::HeapArrayDisposer::allocateImpl
                            (0xa8,0,uVar49,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      uVar36 = auStack_289._33_7_;
      uVar34 = auStack_289._29_4_;
      uVar31 = auStack_289._25_4_;
      uVar29 = auStack_289[0x18];
      uVar27 = auStack_289[0x17];
      uVar8 = auStack_289._21_2_;
      uVar25 = auStack_289._17_4_;
      uVar23 = auStack_289._13_4_;
      uVar20 = auStack_289._9_4_;
      uVar55 = auStack_289[8];
      uVar67 = auStack_289._1_7_;
      uVar17 = stack0xfffffffffffffd74;
      uVar61 = auStack_291._1_4_;
      bVar59 = auStack_291[0];
      local_2a8 = local_2b8 + uVar49;
      local_2a0 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      auStack_289[0x18] = (undefined1)local_428;
      uVar30 = auStack_289[0x18];
      auStack_289._29_3_ = (undefined3)((ulong)local_428 >> 0x28);
      uVar33 = auStack_289._29_3_;
      auStack_289._25_4_ = (undefined4)((ulong)local_428 >> 8);
      uVar32 = auStack_289._25_4_;
      auStack_289[0x20] = (undefined1)uStack_420;
      uVar35 = auStack_289[0x20];
      auStack_289._33_7_ = (undefined7)((ulong)uStack_420 >> 8);
      uVar37 = auStack_289._33_7_;
      auStack_289[8] = (undefined1)local_438;
      uVar19 = auStack_289[8];
      auStack_289._13_3_ = (undefined3)((ulong)local_438 >> 0x28);
      uVar22 = auStack_289._13_3_;
      auStack_289._9_4_ = (undefined4)((ulong)local_438 >> 8);
      uVar21 = auStack_289._9_4_;
      auStack_289[0x10] = (undefined1)uStack_430;
      uVar24 = auStack_289[0x10];
      auStack_289[0x17] = (undefined1)((ulong)uStack_430 >> 0x38);
      uVar28 = auStack_289[0x17];
      auStack_289._21_2_ = (undefined2)((ulong)uStack_430 >> 0x28);
      uVar10 = auStack_289._21_2_;
      auStack_289._17_4_ = (undefined4)((ulong)uStack_430 >> 8);
      uVar26 = auStack_289._17_4_;
      auStack_291[0] = SUB81(local_448,0);
      bVar15 = auStack_291[0];
      auStack_291._5_3_ = (undefined3)((ulong)local_448 >> 0x28);
      uVar16 = auStack_291._5_3_;
      auStack_291._1_4_ = (undefined4)((ulong)local_448 >> 8);
      uVar63 = auStack_291._1_4_;
      auStack_289[0] = (undefined1)uStack_440;
      uVar69 = auStack_289[0];
      auStack_289._1_7_ = (undefined7)((ulong)uStack_440 >> 8);
      uVar18 = auStack_289._1_7_;
      index = EVar52;
      pBStack_2b0 = local_2b8;
      auStack_291[0] = bVar59;
      auStack_291._1_4_ = uVar61;
      unique0x1000813b = uVar17;
      auStack_289._1_7_ = uVar67;
      auStack_289[8] = uVar55;
      auStack_289._9_4_ = uVar20;
      auStack_289._13_4_ = uVar23;
      auStack_289._17_4_ = uVar25;
      auStack_289._21_2_ = uVar8;
      auStack_289[0x17] = uVar27;
      auStack_289[0x18] = uVar29;
      auStack_289._25_4_ = uVar31;
      auStack_289._29_4_ = uVar34;
      auStack_289._33_7_ = uVar36;
      if (local_328.elementCount == 0) {
LAB_001d1e07:
        uVar55 = SUB81(pSVar48,0);
        local_1b8.size_ = ((long)pBStack_2b0 - (long)local_2b8 >> 3) * -0x30c30c30c30c30c3;
        local_1b8.ptr = local_2b8;
        local_1b8.disposer = local_2a0;
        local_2b8 = (BrandedDecl *)0x0;
        pBStack_2b0 = (BrandedDecl *)0x0;
        local_2a8 = (BrandedDecl *)0x0;
        BrandedDecl::applyParams
                  ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)&stack0xfffffffffffffb78,
                   (BrandedDecl *)(local_3d8 + 8),&local_1b8,source);
        sVar38 = local_1b8.size_;
        pBVar12 = local_1b8.ptr;
        if (bVar64 == true) {
          if (uVar66 == 2) {
            uStack_1e4 = CONCAT17(uVar70,uVar68);
            EStack_1dc = EVar52;
            local_1d8 = _uStack_46c;
          }
          else if (uVar66 == 1) {
            uStack_1c4 = (undefined4)uStack_458;
            uStack_1c0 = (uint)(CONCAT17(uStack_451,uStack_458) >> 0x20);
            uStack_1d4 = uStack_468;
            uStack_1d0 = _uStack_464;
            uStack_1cc = (undefined4)uStack_460;
            local_1c8 = (uint)(CONCAT17(uStack_459,uStack_460) >> 0x20);
            uStack_1e4 = CONCAT17(uVar70,uVar68);
            EStack_1dc = EVar52;
            local_1d8 = _uStack_46c;
            uVar55 = local_450;
            if (local_450 == 1) {
              auStack_289._29_4_ = CONCAT13(uVar35,uVar33);
              auStack_289._13_4_ = CONCAT13(uVar24,uVar22);
              stack0xfffffffffffffd74 = CONCAT13(uVar69,uVar16);
              auStack_291[0] = bVar15;
              auStack_291._1_4_ = uVar63;
              auStack_289._1_7_ = uVar18;
              auStack_289[8] = uVar19;
              auStack_289._9_4_ = uVar21;
              auStack_289._17_4_ = uVar26;
              auStack_289._21_2_ = uVar10;
              auStack_289[0x17] = uVar28;
              auStack_289[0x18] = uVar30;
              auStack_289._25_4_ = uVar32;
              auStack_289._33_7_ = uVar37;
            }
          }
          pCVar57 = (CapTableReader *)CONCAT44(uStack_414,local_418);
          local_2e8.segment = (SegmentReader *)CONCAT44(uStack_404,local_408);
          local_2e8.capTable = (CapTableReader *)CONCAT44(uStack_3fc,uStack_400);
          local_2e8.data = (void *)CONCAT44(uStack_3f4,local_3f8);
          local_2e8.pointers = (WirePointer *)CONCAT44(uStack_3ec,uStack_3f0);
          local_2e8._44_4_ = uStack_3dc;
          local_2e8.nestingLimit = uStack_3e0;
          local_2e8._36_4_ = uStack_3e4;
          local_2e8.dataSize = local_3e8;
          uVar58 = uStack_410;
          index = uVar66;
        }
        if (local_1b8.ptr != (BrandedDecl *)0x0) {
          local_1b8.ptr = (BrandedDecl *)0x0;
          local_1b8.size_ = 0;
          (**(local_1b8.disposer)->_vptr_ArrayDisposer)
                    (local_1b8.disposer,pBVar12,0xa8,sVar38,sVar38,
                     kj::ArrayDisposer::
                     Dispose_<capnp::compiler::NodeTranslator::BrandedDecl,_false>::destruct);
        }
        (__return_storage_ptr__->ptr).isSet = true;
        if (bVar64 == false) {
          (__return_storage_ptr__->ptr).field_1.value.body.tag = local_3d8._8_4_;
          if (local_3d8._8_4_ == 2) {
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
                 CONCAT44(local_3d8._20_4_,local_3d8._16_4_);
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
                 CONCAT44(local_3d8._28_4_,local_3d8._24_4_);
          }
          else if (local_3d8._8_4_ == 1) {
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = local_3d8._48_8_;
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
                 CONCAT26(local_3d8._38_2_,CONCAT24(local_3d8._36_2_,local_3d8._32_4_));
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = local_3d8._40_8_;
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
                 CONCAT44(local_3d8._20_4_,local_3d8._16_4_);
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
                 CONCAT44(local_3d8._28_4_,local_3d8._24_4_);
            *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = local_3d8[0x38];
            if (local_3d8[0x38] == 1) {
              *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) =
                   local_3d8._96_8_;
              *(Disposer **)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = local_370;
              *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) =
                   local_3d8._80_8_;
              *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) =
                   local_3d8._88_8_;
              *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
                   local_3d8._64_8_;
              *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) =
                   local_3d8._72_8_;
            }
          }
          (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)local_368;
          (__return_storage_ptr__->ptr).field_1.value.brand.ptr = pBStack_360;
          pBStack_360 = (BrandScope *)0x0;
          *(uint *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x98) = uStack_338;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x9c) = uStack_334;
          *(uint *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa0) = uStack_330;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa4) = uStack_32c;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x88) = uStack_348;
          *(uint *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x8c) = uStack_344;
          *(StructDataBitCount *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x90) = local_340;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x94) = uStack_33c;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x78) = uStack_358;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x7c) = uStack_354;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x80) = uStack_350;
          *(ElementCount *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x84) = EStack_34c;
        }
        else {
          (__return_storage_ptr__->ptr).field_1.value.body.tag = index;
          if (index == 2) {
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = uStack_1e4;
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
                 CONCAT44(local_1d8,EStack_1dc);
          }
          else if (index == 1) {
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
                 CONCAT44(uStack_1c0,uStack_1c4);
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
                 CONCAT44(uStack_1d0,uStack_1d4);
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
                 CONCAT44(local_1c8,uStack_1cc);
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = uStack_1e4;
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
                 CONCAT44(local_1d8,EStack_1dc);
            *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = uVar55;
            if ((uVar55 & 1) != 0) {
              *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) =
                   CONCAT35(auStack_289._29_3_,CONCAT41(auStack_289._25_4_,auStack_289[0x18]));
              *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) =
                   CONCAT71(auStack_289._33_7_,auStack_289[0x20]);
              *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) =
                   CONCAT35(auStack_289._13_3_,CONCAT41(auStack_289._9_4_,auStack_289[8]));
              *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) =
                   CONCAT17(auStack_289[0x17],
                            CONCAT25(auStack_289._21_2_,
                                     CONCAT41(auStack_289._17_4_,auStack_289[0x10])));
              *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
                   CONCAT35(auStack_291._5_3_,CONCAT41(auStack_291._1_4_,auStack_291[0]));
              *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) =
                   CONCAT71(auStack_289._1_7_,auStack_289[0]);
            }
          }
          (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)pCVar57;
          (__return_storage_ptr__->ptr).field_1.value.brand.ptr = (BrandScope *)uVar58;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x78) =
               local_2e8.segment._0_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x7c) =
               local_2e8.segment._4_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x80) =
               local_2e8.capTable._0_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x84) =
               local_2e8.capTable._4_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x88) =
               local_2e8.data._0_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x8c) =
               local_2e8.data._4_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x90) =
               local_2e8.pointers._0_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x94) =
               local_2e8.pointers._4_4_;
          *(StructDataBitCount *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x98) =
               local_2e8.dataSize;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x9c) = local_2e8._36_4_;
          *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa0) = local_2e8.nestingLimit;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa4) = local_2e8._44_4_;
          uVar58 = (BrandScope *)0x0;
        }
        if ((bVar64 & (BrandScope *)uVar58 != (BrandScope *)0x0) == 1) {
          (**pCVar57->_vptr_CapTableReader)
                    (pCVar57,&((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)
                              &((BrandScope *)uVar58)->super_Refcounted)->isSet +
                             *(long *)(*(long *)&((BrandScope *)uVar58)->super_Refcounted + -0x10));
        }
      }
      else {
        uVar58 = &stack0xfffffffffffffb88;
        local_2f0 = (Own<capnp::compiler::NodeTranslator::BrandScope> *)0x0;
        index = 0;
        uVar56 = __return_storage_ptr__;
        LVar62 = local_328.elementCount;
        do {
          uVar7 = uStack_410;
          capnp::_::ListReader::getStructElement(&local_2e8,&local_328,index);
          if ((0xf < local_2e8.dataSize) && (*local_2e8.data == 1)) {
            pCVar42 = local_2e8.capTable;
            pWVar46 = local_2e8.pointers;
            pSVar54 = local_2e8.segment;
            auStack_289._9_4_ = local_2e8.nestingLimit;
            if (local_2e8.pointerCount == 0) {
              pCVar42 = (CapTableReader *)0x0;
              pWVar46 = (WirePointer *)0x0;
              pSVar54 = (SegmentReader *)0x0;
              auStack_289._9_4_ = 0x7fffffff;
            }
            pEVar3 = this->errorReporter;
            local_298[0] = SUB81(pSVar54,0);
            local_298._1_6_ = (undefined6)((ulong)pSVar54 >> 8);
            auStack_291[0] = SUB81((ulong)pSVar54 >> 0x38,0);
            auStack_291._1_4_ = SUB84(pCVar42,0);
            stack0xfffffffffffffd74 = (undefined4)((ulong)pCVar42 >> 0x20);
            auStack_289._1_7_ = SUB87(pWVar46,0);
            auStack_289[8] = (undefined1)((ulong)pWVar46 >> 0x38);
            capnp::_::PointerReader::getStruct
                      ((StructReader *)&stack0xfffffffffffffb78,(PointerReader *)local_298,
                       (word *)0x0);
            uVar49 = 0;
            uVar53 = 0;
            if (0x1f < (uint)uStack_468) {
              uVar53 = (ulong)*(uint *)CONCAT17(uVar70,uVar68);
            }
            if (0x3f < (uint)uStack_468) {
              uVar49 = (ulong)*(uint *)(CONCAT17(uVar70,uVar68) + 4);
            }
            (**pEVar3->_vptr_ErrorReporter)
                      (pEVar3,uVar53,uVar49,"Named parameter not allowed here.",0x22);
          }
          if (local_2e8.pointerCount < 2) {
            local_178.nestingLimit = 0x7fffffff;
            local_178.capTable = (CapTableReader *)0x0;
            local_178.pointer = (WirePointer *)0x0;
            local_178.segment = (SegmentReader *)0x0;
          }
          else {
            local_178.pointer = local_2e8.pointers + 1;
            local_178.capTable = local_2e8.capTable;
            local_178.segment = local_2e8.segment;
            local_178.nestingLimit = local_2e8.nestingLimit;
          }
          capnp::_::PointerReader::getStruct(&local_c0,&local_178,(word *)0x0);
          implicitMethodParams_02.params.reader.step = implicitMethodParams.params.reader.step;
          implicitMethodParams_02.params.reader.elementCount =
               implicitMethodParams.params.reader.elementCount;
          source_02._reader.capTable = local_c0.capTable;
          source_02._reader.segment = local_c0.segment;
          source_02._reader.data = local_c0.data;
          source_02._reader.pointers = local_c0.pointers;
          source_02._reader.dataSize = local_c0.dataSize;
          source_02._reader.pointerCount = local_c0.pointerCount;
          source_02._reader._38_2_ = local_c0._38_2_;
          source_02._reader.nestingLimit = local_c0.nestingLimit;
          source_02._reader._44_4_ = local_c0._44_4_;
          implicitMethodParams_02.params.reader.segment = implicitMethodParams.params.reader.segment
          ;
          implicitMethodParams_02.scopeId = implicitMethodParams.scopeId;
          implicitMethodParams_02.params.reader.capTable =
               implicitMethodParams.params.reader.capTable;
          implicitMethodParams_02.params.reader.ptr = implicitMethodParams.params.reader.ptr;
          implicitMethodParams_02.params.reader.structDataSize =
               implicitMethodParams.params.reader.structDataSize;
          implicitMethodParams_02.params.reader.structPointerCount =
               implicitMethodParams.params.reader.structPointerCount;
          implicitMethodParams_02.params.reader.elementSize =
               implicitMethodParams.params.reader.elementSize;
          implicitMethodParams_02.params.reader._39_1_ = implicitMethodParams.params.reader._39_1_;
          implicitMethodParams_02.params.reader.nestingLimit =
               implicitMethodParams.params.reader.nestingLimit;
          implicitMethodParams_02.params.reader._44_4_ = implicitMethodParams.params.reader._44_4_;
          pMVar43 = compileDeclExpression
                              ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)
                               &stack0xfffffffffffffb78,this,source_02,resolver,
                               implicitMethodParams_02);
          if (bVar64 == true) {
            pCVar57 = (CapTableReader *)(ulong)(uint)uVar66;
            if (uVar66 == 2) {
              local_118 = (void *)CONCAT17(uVar70,uVar68);
              auStack_110._0_8_ = CONCAT44(_uStack_46c,EVar52);
              pMVar43 = (Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)&local_118;
            }
            else if (uVar66 == 1) {
              auStack_110._24_8_ = CONCAT17(uStack_451,uStack_458);
              local_118 = (void *)CONCAT17(uVar70,uVar68);
              auStack_110._0_8_ = CONCAT44(_uStack_46c,EVar52);
              auStack_110._8_8_ = CONCAT44(_uStack_464,uStack_468);
              auStack_110._16_8_ = CONCAT17(uStack_459,uStack_460);
              pMVar43 = (Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)
                        CONCAT71((int7)((ulong)auStack_110._24_8_ >> 8),local_450);
              local_4a1 = local_450;
              if (local_450 == 1) {
                pMVar43 = (Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)auStack_291;
                auStack_289._29_4_ = CONCAT13(uVar35,uVar33);
                auStack_289._13_4_ = CONCAT13(uVar24,uVar22);
                stack0xfffffffffffffd74 = CONCAT13(uVar69,uVar16);
                auStack_291[0] = bVar15;
                auStack_291._1_4_ = uVar63;
                auStack_289._1_7_ = uVar18;
                auStack_289[8] = uVar19;
                auStack_289._9_4_ = uVar21;
                auStack_289._17_4_ = uVar26;
                auStack_289._21_2_ = uVar10;
                auStack_289[0x17] = uVar28;
                auStack_289[0x18] = uVar30;
                auStack_289._25_4_ = uVar32;
                auStack_289._33_7_ = uVar37;
              }
            }
            pSVar48 = (SegmentReader *)CONCAT44(uStack_414,local_418);
            uStack_1e4 = CONCAT44(uStack_400,uStack_404);
            uStack_1bc = uStack_3dc;
            uStack_1c0 = uStack_3e0;
            uStack_1c4 = uStack_3e4;
            local_1c8 = local_3e8;
            uStack_1cc = uStack_3ec;
            uStack_1d0 = uStack_3f0;
            uStack_1d4 = uStack_3f4;
            local_1d8 = local_3f8;
            EStack_1dc = uStack_3fc;
            auStack_289._161_4_ = local_408;
            uStack_410 = (BrandScope *)0x0;
            if (uVar66 == 1) {
              uVar66 = 0;
            }
            uVar56 = uVar7;
            if (uVar66 == 2) {
              uVar66 = 0;
            }
          }
          uVar45 = (uint)pCVar57;
          if (bVar64 == false) {
            local_2f0 = (Own<capnp::compiler::NodeTranslator::BrandScope> *)
                        CONCAT71((int7)((ulong)pMVar43 >> 8),1);
          }
          else {
            (pBStack_2b0->body).tag = uVar45;
            if (uVar45 == 2) {
              (pBStack_2b0->body).field_1.forceAligned = local_118;
              *(undefined8 *)((long)&(pBStack_2b0->body).field_1 + 8) = auStack_110._0_8_;
            }
            else if (uVar45 == 1) {
              *(undefined8 *)((long)&(pBStack_2b0->body).field_1 + 0x20) = auStack_110._24_8_;
              *(undefined8 *)((long)&(pBStack_2b0->body).field_1 + 0x10) = auStack_110._8_8_;
              *(undefined8 *)((long)&(pBStack_2b0->body).field_1 + 0x18) = auStack_110._16_8_;
              (pBStack_2b0->body).field_1.forceAligned = local_118;
              *(undefined8 *)((long)&(pBStack_2b0->body).field_1 + 8) = auStack_110._0_8_;
              (pBStack_2b0->body).field_1.space[0x28] = local_4a1;
              if ((local_4a1 & 1) != 0) {
                *(ulong *)((long)&(pBStack_2b0->body).field_1 + 0x50) =
                     CONCAT35(auStack_289._29_3_,CONCAT41(auStack_289._25_4_,auStack_289[0x18]));
                *(ulong *)((long)&(pBStack_2b0->body).field_1 + 0x58) =
                     CONCAT71(auStack_289._33_7_,auStack_289[0x20]);
                *(ulong *)((long)&(pBStack_2b0->body).field_1 + 0x40) =
                     CONCAT35(auStack_289._13_3_,CONCAT41(auStack_289._9_4_,auStack_289[8]));
                *(ulong *)((long)&(pBStack_2b0->body).field_1 + 0x48) =
                     CONCAT17(auStack_289[0x17],
                              CONCAT25(auStack_289._21_2_,
                                       CONCAT41(auStack_289._17_4_,auStack_289[0x10])));
                *(ulong *)((long)&(pBStack_2b0->body).field_1 + 0x30) =
                     CONCAT35(auStack_291._5_3_,CONCAT41(auStack_291._1_4_,auStack_291[0]));
                *(ulong *)((long)&(pBStack_2b0->body).field_1 + 0x38) =
                     CONCAT71(auStack_289._1_7_,auStack_289[0]);
              }
            }
            (pBStack_2b0->brand).disposer = (Disposer *)pSVar48;
            (pBStack_2b0->brand).ptr = (BrandScope *)uVar56;
            *(undefined4 *)&(pBStack_2b0->source)._reader.segment = auStack_289._161_4_;
            *(undefined4 *)((long)&(pBStack_2b0->source)._reader.segment + 4) =
                 (undefined4)uStack_1e4;
            *(undefined4 *)&(pBStack_2b0->source)._reader.capTable = uStack_1e4._4_4_;
            *(ElementCount *)((long)&(pBStack_2b0->source)._reader.capTable + 4) = EStack_1dc;
            (pBStack_2b0->source)._reader.data = (void *)CONCAT44(uStack_1d4,local_1d8);
            (pBStack_2b0->source)._reader.pointers = (WirePointer *)CONCAT44(uStack_1cc,uStack_1d0);
            (pBStack_2b0->source)._reader.dataSize = local_1c8;
            (pBStack_2b0->source)._reader.pointerCount = (short)uStack_1c4;
            *(short *)&(pBStack_2b0->source)._reader.field_0x26 = (short)((uint)uStack_1c4 >> 0x10);
            *(ulong *)&(pBStack_2b0->source)._reader.nestingLimit = CONCAT44(uStack_1bc,uStack_1c0);
            pBStack_2b0 = pBStack_2b0 + 1;
            uVar56 = (BrandScope *)0x0;
          }
          if (bVar64 != false) {
            if ((BrandScope *)uVar56 != (BrandScope *)0x0) {
              (*(code *)pSVar48->arena->_vptr_Arena)
                        (pSVar48,&((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)
                                  &((BrandScope *)uVar56)->super_Refcounted)->isSet +
                                 *(long *)(*(long *)&((BrandScope *)uVar56)->super_Refcounted +
                                          -0x10));
              uVar56 = (BrandScope *)0x0;
            }
            if (uVar45 == 1) {
              uVar45 = 0;
            }
            pCVar57 = (CapTableReader *)(ulong)uVar45;
            if (uVar45 == 2) {
              pCVar57 = (CapTableReader *)0x0;
            }
          }
          index = index + 1;
        } while (LVar62 != index);
        if (((ulong)local_2f0 & 1) == 0) goto LAB_001d1e07;
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.body.tag = local_3d8._8_4_;
        if (local_3d8._8_4_ == 2) {
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
               CONCAT44(local_3d8._20_4_,local_3d8._16_4_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
               CONCAT44(local_3d8._28_4_,local_3d8._24_4_);
        }
        else if (local_3d8._8_4_ == 1) {
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = local_3d8._48_8_;
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
               CONCAT26(local_3d8._38_2_,CONCAT24(local_3d8._36_2_,local_3d8._32_4_));
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = local_3d8._40_8_;
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
               CONCAT44(local_3d8._20_4_,local_3d8._16_4_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
               CONCAT44(local_3d8._28_4_,local_3d8._24_4_);
          *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = local_3d8[0x38];
          if (local_3d8[0x38] == 1) {
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = local_3d8._96_8_;
            *(Disposer **)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = local_370;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = local_3d8._80_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = local_3d8._88_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = local_3d8._64_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = local_3d8._72_8_;
          }
        }
        (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)local_368;
        (__return_storage_ptr__->ptr).field_1.value.brand.ptr = pBStack_360;
        pBStack_360 = (BrandScope *)0x0;
        pNVar6 = &__return_storage_ptr__->ptr;
        *(uint *)((long)&pNVar6->field_1 + 0x98) = uStack_338;
        *(short *)((long)&pNVar6->field_1 + 0x9c) = (short)uStack_334;
        *(short *)((long)&pNVar6->field_1 + 0x9e) = SUB42(uStack_334,2);
        *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.source._reader.nestingLimit =
             CONCAT44(uStack_32c,uStack_330);
        (__return_storage_ptr__->ptr).field_1.value.source._reader.data =
             (void *)CONCAT44(uStack_344,uStack_348);
        (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers =
             (WirePointer *)CONCAT44(uStack_33c,local_340);
        (__return_storage_ptr__->ptr).field_1.value.source._reader.segment =
             (SegmentReader *)CONCAT44(uStack_354,uStack_358);
        (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
             (CapTableReader *)CONCAT44(EStack_34c,uStack_350);
      }
      pBVar14 = local_2a8;
      pBVar13 = pBStack_2b0;
      pBVar12 = local_2b8;
      if (local_2b8 != (BrandedDecl *)0x0) {
        local_2b8 = (BrandedDecl *)0x0;
        pBStack_2b0 = (BrandedDecl *)0x0;
        local_2a8 = (BrandedDecl *)0x0;
        (**local_2a0->_vptr_ArrayDisposer)
                  (local_2a0,pBVar12,0xa8,((long)pBVar13 - (long)pBVar12 >> 3) * -0x30c30c30c30c30c3
                   ,((long)pBVar14 - (long)pBVar12 >> 3) * -0x30c30c30c30c30c3,
                   kj::ArrayDisposer::Dispose_<capnp::compiler::NodeTranslator::BrandedDecl,_false>
                   ::destruct);
      }
    }
    else {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    pBVar41 = pBStack_360;
    if ((local_3d8[0] == (_)0x1) && (pBStack_360 != (BrandScope *)0x0)) {
      pBStack_360 = (BrandScope *)0x0;
      (**(local_368->super_Refcounted).super_Disposer._vptr_Disposer)
                (local_368,
                 &((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)
                  &pBVar41->super_Refcounted)->isSet +
                 *(long *)(*(long *)&pBVar41->super_Refcounted + -0x10));
    }
    break;
  case 10:
    pCVar57 = source._reader.capTable;
    pWVar46 = source._reader.pointers;
    pSVar48 = source._reader.segment;
    iVar39 = source._reader.nestingLimit;
    if (source._reader.pointerCount == 0) {
      pCVar57 = (CapTableReader *)0x0;
      pWVar46 = (WirePointer *)0x0;
      pSVar48 = (SegmentReader *)0x0;
      iVar39 = 0x7fffffff;
    }
    bVar59 = SUB81(pSVar48,0);
    uVar63 = SUB84(pCVar57,0);
    uVar67 = SUB87(pWVar46,0);
    uVar69 = (undefined1)((ulong)pWVar46 >> 0x38);
    uVar51 = source._reader.nestingLimit;
    pCVar57 = source._reader.capTable;
    capnp::_::PointerReader::getStruct
              (&local_90,(PointerReader *)&stack0xfffffffffffffb78,(word *)0x0);
    implicitMethodParams_00.params.reader.step = implicitMethodParams.params.reader.step;
    implicitMethodParams_00.params.reader.elementCount =
         implicitMethodParams.params.reader.elementCount;
    source_00._reader.capTable = local_90.capTable;
    source_00._reader.segment = local_90.segment;
    source_00._reader.data = local_90.data;
    source_00._reader.pointers = local_90.pointers;
    source_00._reader.dataSize = local_90.dataSize;
    source_00._reader.pointerCount = local_90.pointerCount;
    source_00._reader._38_2_ = local_90._38_2_;
    source_00._reader.nestingLimit = local_90.nestingLimit;
    source_00._reader._44_4_ = local_90._44_4_;
    implicitMethodParams_00.params.reader.segment = implicitMethodParams.params.reader.segment;
    implicitMethodParams_00.scopeId = implicitMethodParams.scopeId;
    implicitMethodParams_00.params.reader.capTable = implicitMethodParams.params.reader.capTable;
    implicitMethodParams_00.params.reader.ptr = implicitMethodParams.params.reader.ptr;
    implicitMethodParams_00.params.reader.structDataSize =
         implicitMethodParams.params.reader.structDataSize;
    implicitMethodParams_00.params.reader.structPointerCount =
         implicitMethodParams.params.reader.structPointerCount;
    implicitMethodParams_00.params.reader.elementSize =
         implicitMethodParams.params.reader.elementSize;
    implicitMethodParams_00.params.reader._39_1_ = implicitMethodParams.params.reader._39_1_;
    implicitMethodParams_00.params.reader.nestingLimit =
         implicitMethodParams.params.reader.nestingLimit;
    implicitMethodParams_00.params.reader._44_4_ = implicitMethodParams.params.reader._44_4_;
    compileDeclExpression
              ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)&stack0xfffffffffffffb78,this,
               source_00,resolver,implicitMethodParams_00);
    uVar61 = local_3d8._16_4_;
    local_3d8[0] = (_)bVar59;
    if (bVar59 == true) {
      local_3d8._8_4_ = uVar63;
      local_3d8._16_4_ = (undefined4)uVar67;
      if (uVar63 == 2) {
        local_3d8._20_4_ = (undefined4)(CONCAT17(uVar69,uVar67) >> 0x20);
        uVar61 = local_3d8._16_4_;
        local_3d8._24_4_ = iVar39;
      }
      else if (uVar63 == 1) {
        local_3d8._20_4_ = (undefined4)(CONCAT17(uVar69,uVar67) >> 0x20);
        uVar61 = local_3d8._16_4_;
        local_3d8._24_4_ = iVar39;
        local_3d8._36_2_ = uVar9;
        local_3d8._38_2_ = uVar11;
      }
      local_3d8._16_4_ = uVar61;
      local_368 = (BrandScope *)CONCAT44(uStack_414,local_418);
      pBStack_360 = (BrandScope *)uStack_410;
      uStack_410 = (BrandScope *)0x0;
    }
    if (bVar59 == true) {
      if (source._reader.pointerCount < 2) {
        uStack_470 = 0x7fffffff;
        pCVar42 = (CapTableReader *)0x0;
        pWVar46 = (WirePointer *)0x0;
        pSVar48 = (SegmentReader *)0x0;
      }
      else {
        pWVar46 = source._reader.pointers + 1;
        pCVar42 = pCVar57;
        pSVar48 = source._reader.segment;
        uStack_470 = uVar51;
      }
      uVar65 = (undefined6)((ulong)pSVar48 >> 8);
      uVar55 = (undefined1)((ulong)pSVar48 >> 0x38);
      uVar61 = SUB84(pCVar42,0);
      uVar63 = (undefined4)((ulong)pCVar42 >> 0x20);
      uVar67 = SUB87(pWVar46,0);
      uVar69 = (undefined1)((ulong)pWVar46 >> 0x38);
      capnp::_::PointerReader::getStruct
                ((StructReader *)&local_328,(PointerReader *)&stack0xfffffffffffffb78,(word *)0x0);
      if (local_328.structPointerCount == 0) {
        local_328.nestingLimit = 0x7fffffff;
        local_328.capTable = (CapTableReader *)0x0;
        local_2e8.data = (short *)0x0;
        local_328.segment = (SegmentReader *)0x0;
      }
      else {
        local_2e8.data = (void *)CONCAT44(local_328.step,local_328.elementCount);
      }
      local_2e8.pointers = (WirePointer *)CONCAT44(local_2e8.pointers._4_4_,local_328.nestingLimit);
      local_2e8.segment = local_328.segment;
      local_2e8.capTable = local_328.capTable;
      memberName.content =
           (ArrayPtr<const_char>)
           capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_2e8,(void *)0x0,0);
      BrandedDecl::getMember
                ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)local_298,
                 (BrandedDecl *)(local_3d8 + 8),memberName,source);
      bVar59 = local_298[0];
      uVar40 = auStack_291._1_4_;
      if (local_298[0] == true) {
        if (auStack_291._1_4_ == 2) {
          uStack_470 = auStack_289._9_4_;
          _uStack_46c = auStack_289._13_4_;
          uVar67 = auStack_289._1_7_;
          uVar69 = auStack_289[8];
        }
        else if (auStack_291._1_4_ == 1) {
          uStack_458 = auStack_289._33_7_;
          uStack_451 = auStack_289[0x28];
          uStack_468 = auStack_289._17_4_;
          _uStack_464 = (undefined4)
                        (CONCAT17(auStack_289[0x18],
                                  CONCAT16(auStack_289[0x17],
                                           CONCAT24(auStack_289._21_2_,auStack_289._17_4_))) >> 0x20
                        );
          uStack_460 = (undefined7)CONCAT44(auStack_289._29_4_,auStack_289._25_4_);
          uStack_459 = SUB41(auStack_289._29_4_,3);
          uStack_470 = auStack_289._9_4_;
          _uStack_46c = auStack_289._13_4_;
          local_450 = auStack_289[0x29];
          uVar67 = auStack_289._1_7_;
          uVar69 = auStack_289[8];
          if (auStack_289[0x29] == 1) {
            local_428 = auStack_289._81_8_;
            uStack_420 = auStack_289._89_8_;
            local_438 = auStack_289._65_8_;
            uStack_430 = auStack_289._73_8_;
            local_448 = auStack_289._49_8_;
            uStack_440 = auStack_289._57_8_;
          }
        }
        local_418 = auStack_289._97_4_;
        uStack_414 = auStack_289._101_4_;
        uStack_410 = auStack_289._105_8_;
        local_408 = auStack_289._113_4_;
        uStack_404 = auStack_289._117_4_;
        uStack_400 = auStack_289._121_4_;
        uStack_3fc = auStack_289._125_4_;
        local_3f8 = auStack_289._129_4_;
        uStack_3f4 = auStack_289._133_4_;
        uStack_3f0 = auStack_289._137_4_;
        uStack_3ec = auStack_289._141_4_;
        local_3e8 = auStack_289._145_4_;
        uStack_3e4 = auStack_289._149_4_;
        uStack_3e0 = auStack_289._153_4_;
        uStack_3dc = auStack_289._157_4_;
        auStack_289._105_8_ = (BrandScope *)0x0;
        if (auStack_291._1_4_ == 1) {
          uVar40 = 0;
        }
        uVar61 = auStack_291._1_4_;
        if (uVar40 == 2) {
          uVar40 = 0;
        }
      }
      auStack_291._1_4_ = uVar40;
      if (local_298[0] == true) {
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.body.tag = uVar61;
        if (uVar61 == 2) {
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT17(uVar69,uVar67);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
               CONCAT44(_uStack_46c,uStack_470);
        }
        else if (uVar61 == 1) {
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
               CONCAT17(uStack_451,uStack_458);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
               CONCAT44(_uStack_464,uStack_468);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
               CONCAT17(uStack_459,uStack_460);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT17(uVar69,uVar67);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
               CONCAT44(_uStack_46c,uStack_470);
          *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = local_450;
          if (local_450 == 1) {
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = local_428;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = uStack_420;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = local_438;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = uStack_430;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = local_448;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = uStack_440;
          }
        }
        (__return_storage_ptr__->ptr).field_1.value.brand.disposer =
             (Disposer *)CONCAT44(uStack_414,local_418);
        (__return_storage_ptr__->ptr).field_1.value.brand.ptr = (BrandScope *)uStack_410;
        uStack_410 = (BrandScope *)0x0;
        pNVar6 = &__return_storage_ptr__->ptr;
        *(undefined4 *)((long)&pNVar6->field_1 + 0x98) = local_3e8;
        *(short *)((long)&pNVar6->field_1 + 0x9c) = (short)uStack_3e4;
        *(short *)((long)&pNVar6->field_1 + 0x9e) = (short)((uint)uStack_3e4 >> 0x10);
        *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.source._reader.nestingLimit =
             CONCAT44(uStack_3dc,uStack_3e0);
        (__return_storage_ptr__->ptr).field_1.value.source._reader.data =
             (void *)CONCAT44(uStack_3f4,local_3f8);
        (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers =
             (WirePointer *)CONCAT44(uStack_3ec,uStack_3f0);
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x78) = local_408;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x7c) = uStack_404;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x80) = uStack_400;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x84) = uStack_3fc;
      }
      else {
        pCVar42 = pCVar57;
        auStack_289._9_4_ = uVar51;
        if (source._reader.pointerCount == 0) {
          source._reader.pointers = (WirePointer *)0x0;
          source._reader.segment = (SegmentReader *)0x0;
          pCVar42 = (CapTableReader *)0x0;
          auStack_289._9_4_ = 0x7fffffff;
        }
        pEVar3 = this->errorReporter;
        local_298[0] = SUB81(source._reader.segment,0);
        local_298._1_6_ = (undefined6)((ulong)source._reader.segment >> 8);
        auStack_291[0] = SUB81((ulong)source._reader.segment >> 0x38,0);
        auStack_291._1_4_ = SUB84(pCVar42,0);
        stack0xfffffffffffffd74 = (undefined4)((ulong)pCVar42 >> 0x20);
        auStack_289._1_7_ = SUB87(source._reader.pointers,0);
        auStack_289[8] = (undefined1)((ulong)source._reader.pointers >> 0x38);
        capnp::_::PointerReader::getStruct
                  ((StructReader *)(auStack_110 + 0x20),(PointerReader *)local_298,(word *)0x0);
        name_00._reader.segment._4_4_ = in_stack_fffffffffffffb64;
        name_00._reader.segment._0_4_ = uVar51;
        name_00._reader.capTable = pCVar57;
        name_00._reader.data = resolver;
        name_00._reader.pointers._0_1_ = bVar59;
        name_00._reader.pointers._1_6_ = uVar65;
        name_00._reader.pointers._7_1_ = uVar55;
        name_00._reader.dataSize = uVar61;
        name_00._reader._36_4_ = uVar63;
        name_00._reader._40_7_ = uVar67;
        name_00._reader._47_1_ = uVar69;
        expressionString(name_00);
        RVar60 = LocatedText::Reader::getValue((Reader *)&local_328);
        local_298[0] = RVar60.super_StringPtr.content.ptr._0_1_;
        local_298._1_6_ = RVar60.super_StringPtr.content.ptr._1_6_;
        auStack_291[0] = RVar60.super_StringPtr.content.ptr._7_1_;
        auStack_291._1_4_ = (undefined4)RVar60.super_StringPtr.content.size_;
        stack0xfffffffffffffd74 = RVar60.super_StringPtr.content.size_._4_4_;
        kj::str<char_const(&)[2],kj::String,char_const(&)[24],capnp::Text::Reader,char_const(&)[2]>
                  ((String *)&local_2e8,(kj *)0x272fcb,(char (*) [2])(auStack_289 + 0xa1),
                   (String *)"\' has no member named \'",(char (*) [24])local_298,(Reader *)0x272fcb
                   ,(char (*) [2])auStack_110._32_8_);
        pSVar48 = local_2e8.segment;
        if (local_2e8.capTable == (CapTableReader *)0x0) {
          pSVar48 = (SegmentReader *)0x28616d;
        }
        uVar49 = 0;
        uVar53 = 0;
        if (0x1f < local_328.structDataSize) {
          uVar53 = (ulong)*(uint *)local_328.ptr;
        }
        if (0x3f < local_328.structDataSize) {
          uVar49 = (ulong)*(uint *)((long)local_328.ptr + 4);
        }
        (**pEVar3->_vptr_ErrorReporter)
                  (pEVar3,uVar53,uVar49,pSVar48,
                   (long)&(local_2e8.capTable)->_vptr_CapTableReader +
                   (ulong)(local_2e8.capTable == (CapTableReader *)0x0));
        kj::String::~String((String *)&local_2e8);
        kj::String::~String((String *)(auStack_289 + 0xa1));
        (__return_storage_ptr__->ptr).isSet = false;
      }
      if ((bVar59 == true) && ((BrandScope *)uStack_410 != (BrandScope *)0x0)) {
        (*(code *)**(undefined8 **)CONCAT44(uStack_414,local_418))
                  ((undefined8 *)CONCAT44(uStack_414,local_418),
                   &((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)
                    &((BrandScope *)uStack_410)->super_Refcounted)->isSet +
                   *(long *)(*(long *)&((BrandScope *)uStack_410)->super_Refcounted + -0x10));
      }
    }
    else {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    pBVar41 = pBStack_360;
    if ((local_3d8[0] == (_)0x1) && (pBStack_360 != (BrandScope *)0x0)) {
      pBStack_360 = (BrandScope *)0x0;
      (**(local_368->super_Refcounted).super_Disposer._vptr_Disposer)
                (local_368,
                 &((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)
                  &pBVar41->super_Refcounted)->isSet +
                 *(long *)(*(long *)&pBVar41->super_Refcounted + -0x10));
    }
    break;
  case 0xb:
    local_3d8._8_8_ = source._reader.capTable;
    pWVar46 = source._reader.pointers;
    local_3d8._0_8_ = source._reader.segment;
    local_3d8._24_4_ = source._reader.nestingLimit;
    if (source._reader.pointerCount == 0) {
      local_3d8._8_8_ = (CapTableReader *)0x0;
      pWVar46 = (WirePointer *)0x0;
      local_3d8._0_8_ = (SegmentReader *)0x0;
      local_3d8._24_4_ = 0x7fffffff;
    }
    local_3d8._16_4_ = SUB84(pWVar46,0);
    local_3d8._20_4_ = (undefined4)((ulong)pWVar46 >> 0x20);
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_328,(PointerReader *)local_3d8,(word *)0x0);
    (*resolver->_vptr_Resolver[5])(local_298);
    local_2e8.data = (void *)0x0;
    local_2e8.segment = (SegmentReader *)0x0;
    local_2e8.capTable = (CapTableReader *)0x0;
    iVar39 = 0x7fffffff;
    if (local_328.structPointerCount != 0) {
      local_2e8.data = (void *)CONCAT44(local_328.step,local_328.elementCount);
      local_2e8.segment = local_328.segment;
      local_2e8.capTable = local_328.capTable;
      iVar39 = local_328.nestingLimit;
    }
    plVar5 = (long *)CONCAT17(auStack_289[0x18],
                              CONCAT16(auStack_289[0x17],
                                       CONCAT24(auStack_289._21_2_,auStack_289._17_4_)));
    local_2e8.pointers = (WirePointer *)CONCAT44(local_2e8.pointers._4_4_,iVar39);
    RVar60 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&local_2e8,(void *)0x0,0);
    (**(code **)(*plVar5 + 8))(local_3d8,plVar5,RVar60.super_StringPtr.content.ptr);
    if (local_3d8[0] == (_)0x1) {
      if (local_3d8._8_4_ == 1) {
        local_3d8._8_8_ = local_3d8._8_8_ & 0xffffffff00000000;
      }
      if (local_3d8._8_4_ == 2) {
        local_3d8._8_8_ = local_3d8._8_8_ & 0xffffffff00000000;
      }
    }
    if (local_3d8[0] == (_)0x0) {
      local_3d8._16_4_ = local_328.elementCount;
      local_3d8._20_4_ = local_328.step;
      if (local_328.structPointerCount == 0) {
        local_328.nestingLimit = 0x7fffffff;
        local_328.capTable = (CapTableReader *)0x0;
        local_3d8._16_4_ = 0;
        local_3d8._20_4_ = 0;
        local_328.segment = (SegmentReader *)0x0;
      }
      pEVar3 = this->errorReporter;
      local_3d8._0_8_ = local_328.segment;
      local_3d8._8_8_ = local_328.capTable;
      local_3d8._24_4_ = local_328.nestingLimit;
      RVar60 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)local_3d8,(void *)0x0,0);
      local_2e8.segment = RVar60.super_StringPtr.content.ptr;
      local_3d8._0_8_ = "Not defined: ";
      local_3d8._8_8_ = (CapTableReader *)0xd;
      local_2e8.capTable = (CapTableReader *)(RVar60.super_StringPtr.content.size_ - 1);
      kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                ((String *)local_298,(_ *)local_3d8,(ArrayPtr<const_char> *)&local_2e8,
                 (ArrayPtr<const_char> *)&local_2e8);
      lVar4 = CONCAT44(stack0xfffffffffffffd74,auStack_291._1_4_);
      if (lVar4 == 0) {
        pcVar47 = "";
      }
      else {
        pcVar47 = (char *)CONCAT17(auStack_291[0],CONCAT61(local_298._1_6_,local_298[0]));
      }
      uVar49 = 0;
      uVar53 = 0;
      if (0x1f < local_328.structDataSize) {
        uVar53 = (ulong)*(uint *)local_328.ptr;
      }
      if (0x3f < local_328.structDataSize) {
        uVar49 = (ulong)*(uint *)((long)local_328.ptr + 4);
      }
      (**pEVar3->_vptr_ErrorReporter)(pEVar3,uVar53,uVar49,pcVar47,lVar4 + (ulong)(lVar4 == 0));
      lVar4 = CONCAT17(auStack_291[0],CONCAT61(local_298._1_6_,local_298[0]));
      if (lVar4 != 0) {
        uVar58 = CONCAT44(stack0xfffffffffffffd74,auStack_291._1_4_);
        local_298[0] = false;
        local_298._1_6_ = 0;
        auStack_291[0] = false;
        auStack_291._1_4_ = 0;
        stack0xfffffffffffffd74 = 0;
        (*(code *)**(undefined8 **)CONCAT17(auStack_289[8],auStack_289._1_7_))
                  ((undefined8 *)CONCAT17(auStack_289[8],auStack_289._1_7_),lVar4,1,uVar58,uVar58,0)
        ;
      }
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else {
      interpretResolve((BrandedDecl *)local_3d8,this,resolver,
                       (ResolveResult *)&stack0xfffffffffffffb80,source);
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.body.tag = local_3d8._0_4_;
      if (local_3d8._0_4_ == 2) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = local_3d8._8_8_;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             CONCAT44(local_3d8._20_4_,local_3d8._16_4_);
      }
      else if (local_3d8._0_4_ == 1) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = local_3d8._40_8_;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
             CONCAT44(local_3d8._28_4_,local_3d8._24_4_);
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
             CONCAT26(local_3d8._38_2_,CONCAT24(local_3d8._36_2_,local_3d8._32_4_));
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = local_3d8._8_8_;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             CONCAT44(local_3d8._20_4_,local_3d8._16_4_);
        *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = local_3d8[0x30];
        if (local_3d8[0x30] == '\x01') {
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = local_3d8._88_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = local_3d8._96_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = local_3d8._72_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = local_3d8._80_8_;
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
               CONCAT71(local_3d8._57_7_,local_3d8[0x38]);
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = local_3d8._64_8_;
        }
      }
      (__return_storage_ptr__->ptr).field_1.value.brand.disposer = local_370;
      (__return_storage_ptr__->ptr).field_1.value.brand.ptr = local_368;
      pNVar6 = &__return_storage_ptr__->ptr;
      *(StructDataBitCount *)((long)&pNVar6->field_1 + 0x98) = local_340;
      *(short *)((long)&pNVar6->field_1 + 0x9c) = (short)uStack_33c;
      *(short *)((long)&pNVar6->field_1 + 0x9e) = SUB42(uStack_33c,2);
      *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.source._reader.nestingLimit =
           CONCAT44(uStack_334,uStack_338);
      (__return_storage_ptr__->ptr).field_1.value.source._reader.data =
           (void *)CONCAT44(EStack_34c,uStack_350);
      (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers =
           (WirePointer *)CONCAT44(uStack_344,uStack_348);
      (__return_storage_ptr__->ptr).field_1.value.source._reader.segment =
           (SegmentReader *)pBStack_360;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
           (CapTableReader *)CONCAT44(uStack_354,uStack_358);
    }
    break;
  case 0xc:
    local_3d8._8_8_ = source._reader.capTable;
    pWVar46 = source._reader.pointers;
    local_3d8._0_8_ = source._reader.segment;
    local_3d8._24_4_ = source._reader.nestingLimit;
    if (source._reader.pointerCount == 0) {
      local_3d8._8_8_ = (CapTableReader *)0x0;
      pWVar46 = (WirePointer *)0x0;
      local_3d8._0_8_ = (SegmentReader *)0x0;
      local_3d8._24_4_ = 0x7fffffff;
    }
    local_3d8._16_4_ = SUB84(pWVar46,0);
    local_3d8._20_4_ = (undefined4)((ulong)pWVar46 >> 0x20);
    pCVar57 = (CapTableReader *)0x0;
    capnp::_::PointerReader::getStruct
              ((StructReader *)local_298,(PointerReader *)local_3d8,(word *)0x0);
    local_3d8._16_4_ = 0;
    local_3d8._20_4_ = 0;
    local_3d8._0_8_ = (SegmentReader *)0x0;
    uVar51 = 0x7fffffff;
    if (auStack_289._21_2_ != 0) {
      local_3d8._0_8_ = CONCAT17(auStack_291[0],CONCAT61(local_298._1_6_,local_298[0]));
      pCVar57 = (CapTableReader *)CONCAT44(stack0xfffffffffffffd74,auStack_291._1_4_);
      uVar51 = auStack_289._25_4_;
      local_3d8._16_4_ = auStack_289._9_4_;
      local_3d8._20_4_ = auStack_289._13_4_;
    }
    local_3d8._8_8_ = pCVar57;
    local_3d8._24_4_ = uVar51;
    RVar60 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_3d8,(void *)0x0,0)
    ;
    (*resolver->_vptr_Resolver[8])
              ((CapTableReader *)local_3d8,resolver,RVar60.super_StringPtr.content.ptr);
    pCVar42 = (CapTableReader *)local_3d8;
    pMVar43 = __return_storage_ptr__;
    if (local_3d8[0] == (_)0x1) {
      local_198 = CONCAT44(local_3d8._24_4_,local_3d8._20_4_);
      uStack_190 = CONCAT44(local_3d8._32_4_,local_3d8._28_4_);
      local_188 = CONCAT22(local_3d8._38_2_,local_3d8._36_2_);
      pMVar43 = (Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)(local_3d8._48_8_ & 0xff);
      pCVar42 = (CapTableReader *)local_3d8._8_8_;
      pCVar57 = (CapTableReader *)local_3d8._40_8_;
      uVar51 = local_3d8._16_4_;
      if (local_3d8[0x30] == '\x01') {
        local_461 = (undefined1)local_3d8._88_8_;
        uStack_460 = SUB87(local_3d8._88_8_,1);
        uStack_459 = (undefined1)local_3d8._96_8_;
        uStack_458 = SUB87(local_3d8._96_8_,1);
        in_stack_fffffffffffffb8f = (undefined1)local_3d8._72_8_;
        uStack_470 = SUB84(local_3d8._72_8_,1);
        uStack_46c = SUB83(local_3d8._72_8_,5);
        uStack_469 = (undefined1)local_3d8._80_8_;
        uStack_468 = SUB84(local_3d8._80_8_,1);
        uStack_464 = SUB83(local_3d8._80_8_,5);
        in_stack_fffffffffffffb80 = (undefined4)local_3d8._57_7_;
        in_stack_fffffffffffffb84._0_3_ = SUB73(local_3d8._57_7_,4);
        in_stack_fffffffffffffb84._3_1_ = (undefined1)local_3d8._64_8_;
        in_stack_fffffffffffffb88 = SUB87(local_3d8._64_8_,1);
        in_stack_fffffffffffffb7f = local_3d8[0x38];
      }
    }
    if (local_3d8[0] != (_)0x0) {
      if (((ulong)pMVar43 & 1) != 0) {
        local_158 = CONCAT35((int3)in_stack_fffffffffffffb84,
                             CONCAT41(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7f));
        uStack_150 = CONCAT71(in_stack_fffffffffffffb88,
                              (char)((uint)in_stack_fffffffffffffb84 >> 0x18));
        local_148 = CONCAT35(uStack_46c,CONCAT41(uStack_470,in_stack_fffffffffffffb8f));
        uStack_140 = CONCAT35(uStack_464,CONCAT41(uStack_468,uStack_469));
        local_138 = CONCAT71(uStack_460,local_461);
        uStack_130 = CONCAT71(uStack_458,uStack_459);
      }
      pEVar3 = this->errorReporter;
      pBVar41 = (BrandScope *)operator_new(0x50);
      BrandScope(pBVar41,pEVar3,(uint64_t)pCVar42,uVar51,(Resolver *)pCVar57);
      puVar1 = &(pBVar41->super_Refcounted).refcount;
      *puVar1 = *puVar1 + 1;
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.body.tag = 1;
      *(CapTableReader **)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = pCVar42;
      *(uint *)((long)&(__return_storage_ptr__->ptr).field_1.value.body.field_1 + 8) = uVar51;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x14) = local_198;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x1c) = uStack_190;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1.value.body.field_1 + 0x1c) =
           local_188;
      *(CapTableReader **)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = pCVar57;
      *(char *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = (char)pMVar43;
      if (((ulong)pMVar43 & 1) != 0) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = local_138;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = uStack_130;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = local_148;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = uStack_140;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = local_158;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = uStack_150;
      }
      (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)pBVar41;
      (__return_storage_ptr__->ptr).field_1.value.brand.ptr = pBVar41;
      uVar58 = source._reader._32_8_;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.segment = source._reader.segment;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable = source._reader.capTable;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.data = source._reader.data;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers = source._reader.pointers;
      pNVar6 = &__return_storage_ptr__->ptr;
      *(int *)((long)&pNVar6->field_1 + 0x98) = (int)uVar58;
      *(short *)((long)&pNVar6->field_1 + 0x9c) = (short)((ulong)uVar58 >> 0x20);
      *(short *)((long)&pNVar6->field_1 + 0x9e) = (short)((ulong)uVar58 >> 0x30);
      *(long *)&(__return_storage_ptr__->ptr).field_1.value.source._reader.nestingLimit =
           source._reader._40_8_;
      return __return_storage_ptr__;
    }
    if (auStack_289._21_2_ == 0) {
      auStack_289._25_4_ = 0x7fffffff;
      local_3d8._8_8_ = (CapTableReader *)0x0;
      local_3d8._16_4_ = 0;
      local_3d8._20_4_ = 0;
      local_3d8._0_8_ = (SegmentReader *)0x0;
    }
    else {
      local_3d8._0_8_ = CONCAT17(auStack_291[0],CONCAT61(local_298._1_6_,local_298[0]));
      local_3d8._8_8_ = CONCAT44(stack0xfffffffffffffd74,auStack_291._1_4_);
      local_3d8._16_4_ = auStack_289._9_4_;
      local_3d8._20_4_ = auStack_289._13_4_;
    }
    pEVar3 = this->errorReporter;
    local_3d8._24_4_ = auStack_289._25_4_;
    RVar60 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_3d8,(void *)0x0,0)
    ;
    local_2e8.segment = RVar60.super_StringPtr.content.ptr;
    local_3d8._0_8_ = "Import failed: ";
    local_3d8._8_8_ = (CapTableReader *)0xf;
    local_2e8.capTable = (CapTableReader *)(RVar60.super_StringPtr.content.size_ - 1);
    kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              ((String *)&local_328,(_ *)local_3d8,(ArrayPtr<const_char> *)&local_2e8,
               (ArrayPtr<const_char> *)&local_2e8);
    pSVar48 = local_328.segment;
    if (local_328.capTable == (CapTableReader *)0x0) {
      pSVar48 = (SegmentReader *)0x28616d;
    }
    uVar49 = 0;
    uVar53 = 0;
    if (0x1f < (uint)auStack_289._17_4_) {
      uVar53 = (ulong)*(uint *)CONCAT17(auStack_289[8],auStack_289._1_7_);
    }
    if (0x3f < (uint)auStack_289._17_4_) {
      uVar49 = (ulong)*(uint *)(CONCAT17(auStack_289[8],auStack_289._1_7_) + 4);
    }
    (**pEVar3->_vptr_ErrorReporter)
              (pEVar3,uVar53,uVar49,pSVar48,
               (long)&(local_328.capTable)->_vptr_CapTableReader +
               (ulong)(local_328.capTable == (CapTableReader *)0x0));
    pCVar57 = local_328.capTable;
    pSVar48 = local_328.segment;
    if (local_328.segment != (SegmentReader *)0x0) {
      local_328.segment = (SegmentReader *)0x0;
      local_328.capTable = (CapTableReader *)0x0;
      (*(code *)**(undefined8 **)local_328.ptr)(local_328.ptr,pSVar48,1,pCVar57,pCVar57,0);
    }
switchD_001d0874_caseD_0:
    (__return_storage_ptr__->ptr).isSet = false;
    break;
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::BrandedDecl> NodeTranslator::BrandScope::compileDeclExpression(
    Expression::Reader source, Resolver& resolver,
    ImplicitParams implicitMethodParams) {
  switch (source.which()) {
    case Expression::UNKNOWN:
      // Error reported earlier.
      return nullptr;

    case Expression::POSITIVE_INT:
    case Expression::NEGATIVE_INT:
    case Expression::FLOAT:
    case Expression::STRING:
    case Expression::BINARY:
    case Expression::LIST:
    case Expression::TUPLE:
    case Expression::EMBED:
      errorReporter.addErrorOn(source, "Expected name.");
      return nullptr;

    case Expression::RELATIVE_NAME: {
      auto name = source.getRelativeName();
      auto nameValue = name.getValue();

      // Check implicit method params first.
      for (auto i: kj::indices(implicitMethodParams.params)) {
        if (implicitMethodParams.params[i].getName() == nameValue) {
          if (implicitMethodParams.scopeId == 0) {
            return BrandedDecl::implicitMethodParam(i);
          } else {
            return BrandedDecl(Resolver::ResolvedParameter {
                implicitMethodParams.scopeId, static_cast<uint16_t>(i) },
                Expression::Reader());
          }
        }
      }

      KJ_IF_MAYBE(r, resolver.resolve(nameValue)) {
        return interpretResolve(resolver, *r, source);
      } else {
        errorReporter.addErrorOn(name, kj::str("Not defined: ", nameValue));
        return nullptr;
      }
    }

    case Expression::ABSOLUTE_NAME: {
      auto name = source.getAbsoluteName();
      KJ_IF_MAYBE(r, resolver.getTopScope().resolver->resolveMember(name.getValue())) {
        return interpretResolve(resolver, *r, source);
      } else {
        errorReporter.addErrorOn(name, kj::str("Not defined: ", name.getValue()));
        return nullptr;
      }
    }